

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O2

VCacheData __thiscall VGradientCache::getBuffer(VGradientCache *this,VGradient *gradient)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  iterator iVar4;
  _Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
  _Var5;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VGradient *pVVar6;
  uint32_t i;
  ulong uVar7;
  __node_base __mutex;
  long lVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>_>
  pVar9;
  VCacheData VVar10;
  VGradient *local_50;
  __node_base local_38;
  
  (this->mCache)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->mCache)._M_h._M_bucket_count = 0;
  lVar8 = 4;
  pVVar6 = (VGradient *)0x0;
  for (uVar7 = 0;
      (uVar7 < 3 && (uVar7 < (ulong)(*(long *)(in_RDX + 0x18) - *(long *)(in_RDX + 0x10) >> 3)));
      uVar7 = uVar7 + 1) {
    uVar2 = VColor::premulARGB((VColor *)(*(long *)(in_RDX + 0x10) + lVar8));
    pVVar6 = (VGradient *)((long)&pVVar6->mType + (long)((float)uVar2 * *(float *)(in_RDX + 0x28)));
    lVar8 = lVar8 + 8;
  }
  __mutex._M_nxt = (_Hash_node_base *)((long)&gradient->field_5 + 0xc);
  local_50 = pVVar6;
  std::mutex::lock((mutex *)__mutex._M_nxt);
  sVar3 = std::
          _Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::count((_Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   *)gradient,(key_type *)&local_50);
  if (sVar3 == 0) {
LAB_0010e1f8:
    addCacheElement((VGradientCache *)&stack0xffffffffffffffb8,(VCacheKey)gradient,local_50);
  }
  else {
    if (sVar3 == 1) {
      iVar4 = std::
              _Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::find((_Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                      *)gradient,(key_type *)&local_50);
      bVar1 = std::operator==((vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>
                               *)(*(long *)((long)iVar4.
                                                  super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                                                  ._M_cur + 0x10) + 0x1008),
                              (vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>
                               *)(in_RDX + 0x10));
      if (bVar1) {
        std::__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)this
                   ,(__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)
                    ((long)iVar4.
                           super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                           ._M_cur + 0x10));
        goto LAB_0010e285;
      }
      goto LAB_0010e1f8;
    }
    local_38._M_nxt = __mutex._M_nxt;
    pVar9 = std::
            _Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::equal_range((_Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                           *)gradient,(key_type *)&local_50);
    for (_Var5._M_cur = (__node_type *)
                        pVar9.first.
                        super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                        ._M_cur;
        (_Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
         )_Var5._M_cur !=
        pVar9.second.
        super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
        ; _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt) {
      bVar1 = std::operator==((vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>
                               *)(*(long *)((long)&((_Var5._M_cur)->
                                                                                                      
                                                  super__Hash_node_value<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>
                                                  ._M_storage._M_storage + 8) + 0x1008),
                              (vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>
                               *)(in_RDX + 0x10));
      if (bVar1) {
        std::__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)this
                   ,(__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&((_Var5._M_cur)->
                            super__Hash_node_value<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>
                            ._M_storage._M_storage + 8));
        break;
      }
    }
    __mutex._M_nxt = local_38._M_nxt;
    if ((this->mCache)._M_h._M_buckets != (__buckets_ptr)0x0) goto LAB_0010e285;
    addCacheElement((VGradientCache *)&stack0xffffffffffffffb8,(VCacheKey)gradient,local_50);
  }
  std::__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffb8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
LAB_0010e285:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex._M_nxt);
  VVar10.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  VVar10.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VCacheData)
         VVar10.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VCacheData getBuffer(const VGradient &gradient)
    {
        VCacheKey             hash_val = 0;
        VCacheData            info;
        const VGradientStops &stops = gradient.mStops;
        for (uint32_t i = 0; i < stops.size() && i <= 2; i++)
            hash_val +=
                VCacheKey(stops[i].second.premulARGB() * gradient.alpha());

        {
            std::lock_guard<std::mutex> guard(mMutex);

            size_t count = mCache.count(hash_val);
            if (!count) {
                // key is not present in the hash
                info = addCacheElement(hash_val, gradient);
            } else if (count == 1) {
                auto search = mCache.find(hash_val);
                if (search->second->stops == stops) {
                    info = search->second;
                } else {
                    // didn't find an exact match
                    info = addCacheElement(hash_val, gradient);
                }
            } else {
                // we have a multiple data with same key
                auto range = mCache.equal_range(hash_val);
                for (auto it = range.first; it != range.second; ++it) {
                    if (it->second->stops == stops) {
                        info = it->second;
                        break;
                    }
                }
                if (!info) {
                    // didn't find an exact match
                    info = addCacheElement(hash_val, gradient);
                }
            }
        }
        return info;
    }